

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

tuple<long,_double,_double> * __thiscall
fasttext::FastText::test
          (tuple<long,_double,_double> *__return_storage_ptr__,FastText *this,istream *in,int32_t k,
          real threshold)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  undefined1 local_88 [88];
  undefined1 auStack_30 [16];
  __node_base_ptr p_Stack_20;
  bool local_18;
  
  local_88._56_8_ = &p_Stack_20;
  local_88._0_8_ = 0;
  local_88._8_8_ = 0;
  local_88._16_8_ = 0;
  local_88._24_8_ = (pointer)0x0;
  local_88._32_8_ = (pointer)0x0;
  local_88._40_8_ = (pointer)0x0;
  local_88._48_8_ = 0;
  local_88._72_16_ = ZEXT416(0) << 0x40;
  local_88._64_8_ = 1;
  auStack_30._0_8_ = 0x3f800000;
  local_18 = false;
  unique0x100002ec = local_88._72_16_;
  test(this,in,k,threshold,(Meter *)local_88);
  uVar1 = local_88._48_8_;
  dVar2 = Meter::precision((Meter *)local_88);
  dVar3 = Meter::recall((Meter *)local_88);
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
  super__Head_base<2UL,_double,_false>._M_head_impl = dVar3;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl = dVar2;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_long,_double,_double>).
  super__Head_base<0UL,_long,_false>._M_head_impl = uVar1;
  Meter::~Meter((Meter *)local_88);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<int64_t, double, double>
FastText::test(std::istream& in, int32_t k, real threshold) {
  Meter meter(false);
  test(in, k, threshold, meter);

  return std::tuple<int64_t, double, double>(
      meter.nexamples(), meter.precision(), meter.recall());
}